

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O0

void read_pathway(pathway_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  pathway_mode_t pVar2;
  pathway_directions_t pVar3;
  long lVar4;
  double dVar5;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  pathway_t *record_local;
  
  init_pathway(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"pathway_id");
    if (iVar1 == 0) {
      strcpy(record->id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"from_stop_id");
      if (iVar1 == 0) {
        strcpy(record->from_stop_id,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"to_stop_id");
        if (iVar1 == 0) {
          strcpy(record->to_stop_id,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"pathway_mode");
          if (iVar1 == 0) {
            pVar2 = parse_pathway_mode(field_values[local_2c]);
            record->mode = pVar2;
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"is_bidirectional");
            if (iVar1 == 0) {
              pVar3 = parse_pathway_directions(field_values[local_2c]);
              record->is_bidirectional = pVar3;
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"length");
              if (iVar1 == 0) {
                dVar5 = strtod(field_values[local_2c],(char **)0x0);
                record->length = dVar5;
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"traversal_time");
                if (iVar1 == 0) {
                  lVar4 = strtol(field_values[local_2c],(char **)0x0,0);
                  record->traversal_time = (int)lVar4;
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"stair_count");
                  if (iVar1 == 0) {
                    lVar4 = strtol(field_values[local_2c],(char **)0x0,0);
                    record->stair_count = (int)lVar4;
                  }
                  else {
                    iVar1 = strcmp(field_names[local_2c],"max_slope");
                    if (iVar1 == 0) {
                      dVar5 = strtod(field_values[local_2c],(char **)0x0);
                      record->max_slope = dVar5;
                    }
                    else {
                      iVar1 = strcmp(field_names[local_2c],"min_width");
                      if (iVar1 == 0) {
                        dVar5 = strtod(field_values[local_2c],(char **)0x0);
                        record->min_width = dVar5;
                      }
                      else {
                        iVar1 = strcmp(field_names[local_2c],"signposted_as");
                        if (iVar1 == 0) {
                          strcpy(record->signposted_as,field_values[local_2c]);
                        }
                        else {
                          iVar1 = strcmp(field_names[local_2c],"reversed_signposted_as");
                          if (iVar1 == 0) {
                            strcpy(record->reversed_signposted_as,field_values[local_2c]);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_pathway(pathway_t *record, int field_count, const char **field_names, const char **field_values) {
    init_pathway(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "pathway_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "from_stop_id") == 0) {
            strcpy(record->from_stop_id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "to_stop_id") == 0) {
            strcpy(record->to_stop_id, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "pathway_mode") == 0) {
            record->mode = parse_pathway_mode(field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "is_bidirectional") == 0) {
            record->is_bidirectional = parse_pathway_directions(field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "length") == 0) {
            record->length = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "traversal_time") == 0) {
            record->traversal_time = (int)strtol(field_values[i], NULL, 0);
            continue;
        }

        if (strcmp(field_names[i], "stair_count") == 0) {
            record->stair_count = (int)strtol(field_values[i], NULL, 0);
            continue;
        }

        if (strcmp(field_names[i], "max_slope") == 0) {
            record->max_slope = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "min_width") == 0) {
            record->min_width = strtod(field_values[i], NULL);
            continue;
        }

        if (strcmp(field_names[i], "signposted_as") == 0) {
            strcpy(record->signposted_as, field_values[i]);
            continue;
        }

        if (strcmp(field_names[i], "reversed_signposted_as") == 0) {
            strcpy(record->reversed_signposted_as, field_values[i]);
            continue;
        }
    }
}